

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata.cpp
# Opt level: O2

void __thiscall ByteData_GetVariableIntTest_Test::TestBody(ByteData_GetVariableIntTest_Test *this)

{
  bool bVar1;
  _Base_ptr p_Var2;
  long lVar3;
  char *message;
  initializer_list<std::pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  allocator_type local_2ea;
  less<const_unsigned_long> local_2e9 [9];
  AssertionResult gtest_ar;
  AssertHelper local_2d0;
  int local_2c8 [2];
  ByteData var_int_bytes;
  unsigned_long local_2a8 [8];
  map<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  test_vector;
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_238;
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_210;
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e8;
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c0;
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  local_2c8[1] = 0;
  std::
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[3],_true>(&local_238,local_2c8 + 1,(char (*) [3])0x5e0735);
  local_2c8[0] = 1;
  std::
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[3],_true>(&local_210,local_2c8,(char (*) [3])0x4c7463);
  var_int_bytes.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xfb;
  std::
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<unsigned_long,_const_char_(&)[3],_true>
            (&local_1e8,(unsigned_long *)&var_int_bytes,(char (*) [3])0x476a8b);
  gtest_ar.success_ = true;
  gtest_ar._1_7_ = 0;
  std::
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<unsigned_long,_const_char_(&)[3],_true>
            (&local_1c0,(unsigned_long *)&gtest_ar,(char (*) [3])0x4bf28f);
  local_2d0.data_ = (AssertHelperData *)0xfd;
  std::
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<unsigned_long,_const_char_(&)[7],_true>
            (&local_198,(unsigned_long *)&local_2d0,(char (*) [7])"fdfd00");
  local_2a8[7] = 0xfffe;
  std::
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<unsigned_long,_const_char_(&)[7],_true>(&local_170,local_2a8 + 7,(char (*) [7])"fdfeff");
  local_2a8[6] = 0xffff;
  std::
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<unsigned_long,_const_char_(&)[7],_true>(&local_148,local_2a8 + 6,(char (*) [7])"fdffff");
  local_2a8[5] = 0x10000;
  std::
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<unsigned_long,_const_char_(&)[11],_true>
            (&local_120,local_2a8 + 5,(char (*) [11])"fe00000100");
  local_2a8[4] = 0xfffffffe;
  std::
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<unsigned_long,_const_char_(&)[11],_true>
            (&local_f8,local_2a8 + 4,(char (*) [11])"fefeffffff");
  local_2a8[3] = 0xffffffff;
  std::
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<unsigned_long,_const_char_(&)[11],_true>
            (&local_d0,local_2a8 + 3,(char (*) [11])"feffffffff");
  local_2a8[2] = 0x100000000;
  std::
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<unsigned_long,_const_char_(&)[19],_true>
            (&local_a8,local_2a8 + 2,(char (*) [19])"ff0000000001000000");
  local_2a8[1] = 0xfffffffffffffffe;
  std::
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<unsigned_long,_const_char_(&)[19],_true>
            (&local_80,local_2a8 + 1,(char (*) [19])"fffeffffffffffffff");
  local_2a8[0] = 0xffffffffffffffff;
  std::
  pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<unsigned_long,_const_char_(&)[19],_true>(&local_58,local_2a8,(char (*) [19])0x42a20e);
  __l._M_len = 0xd;
  __l._M_array = &local_238;
  std::
  map<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&test_vector,__l,local_2e9,&local_2ea);
  lVar3 = 0x1e8;
  do {
    std::__cxx11::string::~string((string *)((long)&local_238.first + lVar3));
    lVar3 = lVar3 + -0x28;
  } while (lVar3 != -0x20);
  cfd::core::ByteData::ByteData(&var_int_bytes);
  for (p_Var2 = test_vector._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &test_vector._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var2)) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        cfd::core::ByteData::GetVariableInt((ByteData *)&local_238,*(uint64_t *)(p_Var2 + 1));
        cfd::core::ByteData::operator=(&var_int_bytes,(ByteData *)&local_238);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_238);
      }
    }
    else {
      testing::Message::Message((Message *)&local_238);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata.cpp"
                 ,0xb3,
                 "Expected: var_int_bytes = ByteData::GetVariableInt(citr->first) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_238);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_238);
    }
    cfd::core::ByteData::GetHex_abi_cxx11_((string *)&local_238,&var_int_bytes);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,"var_int_bytes.GetHex().c_str()","citr->second.c_str()",
               (char *)local_238.first,(char *)p_Var2[1]._M_parent);
    std::__cxx11::string::~string((string *)&local_238);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_238);
      message = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_2d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata.cpp"
                 ,0xb4,message);
      testing::internal::AssertHelper::operator=(&local_2d0,(Message *)&local_238);
      testing::internal::AssertHelper::~AssertHelper(&local_2d0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_238);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&var_int_bytes);
  std::
  _Rb_tree<const_unsigned_long,_std::pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<const_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&test_vector._M_t);
  return;
}

Assistant:

TEST(ByteData, GetVariableIntTest) {
  const uint8_t vi_max8 = 252;
  std::map<const uint64_t, const std::string> test_vector = {
    {0, "00"},
    {1, "01"},
    {static_cast<uint64_t>(vi_max8)-1, "fb"},
    {static_cast<uint64_t>(vi_max8), "fc"},
    {static_cast<uint64_t>(vi_max8)+1, "fdfd00"},
    {static_cast<uint64_t>(std::numeric_limits<uint16_t>::max())-1, "fdfeff"},
    {static_cast<uint64_t>(std::numeric_limits<uint16_t>::max()), "fdffff"},
    {static_cast<uint64_t>(std::numeric_limits<uint16_t>::max())+1, "fe00000100"},
    {static_cast<uint64_t>(std::numeric_limits<uint32_t>::max())-1, "fefeffffff"},
    {static_cast<uint64_t>(std::numeric_limits<uint32_t>::max()), "feffffffff"},
    {static_cast<uint64_t>(std::numeric_limits<uint32_t>::max())+1, "ff0000000001000000"},
    {std::numeric_limits<uint64_t>::max()-1, "fffeffffffffffffff"},
    {std::numeric_limits<uint64_t>::max(), "ffffffffffffffffff"},
  };

  ByteData var_int_bytes;
  decltype(test_vector)::const_iterator citr = test_vector.cbegin();
  while (citr != test_vector.cend()) {
    EXPECT_NO_THROW(var_int_bytes = ByteData::GetVariableInt(citr->first));
    EXPECT_STREQ(var_int_bytes.GetHex().c_str(), citr->second.c_str());
    ++citr;
  }
}